

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

DebuggerScope * __thiscall
Js::FunctionBody::AddScopeObject
          (FunctionBody *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation)

{
  Type pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  undefined **local_60;
  DebuggerScope *scopeObject;
  size_t local_50;
  char *local_48;
  DWORD local_40;
  Type local_34;
  
  local_34 = start;
  if ((this->m_sourceInfo).pScopeObjectChain.ptr == (ScopeObjectChain *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ef1,"(GetScopeObjectChain())","GetScopeObjectChain()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_60 = &DebuggerScope::typeinfo;
  scopeObject = (DebuggerScope *)0x0;
  local_50 = 0xffffffffffffffff;
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
  ;
  local_40 = 0x1ef3;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)&stack0xffffffffffffffa0);
  local_60 = (undefined **)new<Memory::Recycler>(0x40,alloc,0x387914);
  pRVar1 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  ((DebuggerScope *)local_60)->_vptr_DebuggerScope = (_func_int **)&PTR__DebuggerScope_014dac18;
  (((DebuggerScope *)local_60)->scopeProperties).ptr =
       (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  ((DebuggerScope *)local_60)->scopeType = scopeType;
  (((DebuggerScope *)local_60)->siblingScope).ptr = (DebuggerScope *)0x0;
  ((DebuggerScope *)local_60)->recycler = pRVar1;
  (((DebuggerScope *)local_60)->parentScope).ptr = (DebuggerScope *)0x0;
  ((DebuggerScope *)local_60)->scopeLocation = scopeLocation;
  (((DebuggerScope *)local_60)->range).begin = local_34;
  (((DebuggerScope *)local_60)->range).end = -1;
  JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add((((this->m_sourceInfo).pScopeObjectChain.ptr)->pScopeChain).ptr,
        (DebuggerScope **)&stack0xffffffffffffffa0);
  return (DebuggerScope *)local_60;
}

Assistant:

DebuggerScope * FunctionBody::AddScopeObject(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation)
    {
        Assert(GetScopeObjectChain());

        DebuggerScope *scopeObject = RecyclerNew(m_scriptContext->GetRecycler(), DebuggerScope, m_scriptContext->GetRecycler(), scopeType, scopeLocation, start);
        GetScopeObjectChain()->pScopeChain->Add(scopeObject);

        return scopeObject;
    }